

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_settings.cpp
# Opt level: O2

ON_ParseSettings * __thiscall
ON_ParseSettings::operator&=(ON_ParseSettings *this,ON_ParseSettings *other)

{
  ushort uVar1;
  long lVar2;
  ushort uVar3;
  
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    this->m_true_default_bits[lVar2] =
         this->m_true_default_bits[lVar2] | other->m_true_default_bits[lVar2];
  }
  for (lVar2 = 2; lVar2 != 4; lVar2 = lVar2 + 1) {
    this->m_true_default_bits[lVar2] =
         this->m_true_default_bits[lVar2] & other->m_true_default_bits[lVar2];
  }
  if (this->m_context_length_unit_system != other->m_context_length_unit_system) {
    this->m_context_length_unit_system = '\0';
  }
  if (this->m_context_angle_unit_system != other->m_context_angle_unit_system) {
    this->m_context_angle_unit_system = '\0';
  }
  if (this->m_context_locale_id != other->m_context_locale_id) {
    uVar1 = this->m_context_locale_id & 0xff;
    uVar3 = 0;
    if (uVar1 == (other->m_context_locale_id & 0xff)) {
      uVar3 = uVar1;
    }
    this->m_context_locale_id = uVar3;
  }
  return this;
}

Assistant:

ON_ParseSettings& ON_ParseSettings::operator&=(const ON_ParseSettings& other)
{
  size_t i;

  for ( i = 0; i < sizeof(m_true_default_bits)/sizeof(m_true_default_bits[0]); i++ )
    m_true_default_bits[i] |= other.m_true_default_bits[i];
  
  for ( i = 0; i < sizeof(m_false_default_bits)/sizeof(m_false_default_bits[0]); i++ )
    m_false_default_bits[i] &= other.m_false_default_bits[i];
  
  if ( m_context_length_unit_system != other.m_context_length_unit_system )
  {
    m_context_length_unit_system = 0;
  }
  
  if ( m_context_angle_unit_system != other.m_context_angle_unit_system )
  {
    m_context_angle_unit_system = 0;
  }
  
  if ( m_context_locale_id != other.m_context_locale_id )
  {
    // If m_context_locale_id != other.m_context_locale_id 
    // identify the same language, then preserve the language.
    // This is useful when parsing unit names, particularly in
    // English where en-US SI unit names end in "er" and many 
    // other en-* SI unit names end in "re".  Setting 
    // m_context_locale_id to "en-ZERO" means that both
    // "meter" and "metre" will get parsed as ON::LengthUnitSystem::Meters.
    unsigned short this_language_id = (m_context_locale_id & 0x00FF);
    unsigned short other_language_id = (other.m_context_locale_id & 0x00FF);
    if ( this_language_id == other_language_id )
      m_context_locale_id = this_language_id;
    else
      m_context_locale_id = 0;
  }

  return *this;
}